

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

line_t * __thiscall FBlockLinesIterator::Next(FBlockLinesIterator *this)

{
  int iVar1;
  int iVar2;
  FPolyObj *pFVar3;
  int *piVar4;
  line_t *plVar5;
  int iVar6;
  polyblock_t *ppVar7;
  int iVar8;
  long lVar9;
  
  do {
    iVar6 = validcount;
    ppVar7 = this->polyLink;
    iVar8 = this->polyIndex;
    while (plVar5 = lines, ppVar7 != (polyblock_t *)0x0) {
      pFVar3 = ppVar7->polyobj;
      iVar1 = iVar8;
      if (pFVar3 == (FPolyObj *)0x0) {
LAB_004b7392:
        iVar8 = iVar1;
        ppVar7 = ppVar7->next;
        this->polyLink = ppVar7;
      }
      else {
        if (iVar8 == 0) {
          iVar1 = 0;
          if (pFVar3->validcount == iVar6) goto LAB_004b7392;
          pFVar3->validcount = iVar6;
        }
        plVar5 = (pFVar3->Linedefs).Array[iVar8];
        iVar8 = iVar8 + 1;
        this->polyIndex = iVar8;
        if ((int)(pFVar3->Linedefs).Count <= iVar8) {
          ppVar7 = ppVar7->next;
          this->polyLink = ppVar7;
          this->polyIndex = 0;
          iVar8 = 0;
        }
        if (plVar5->validcount != iVar6) goto LAB_004b7405;
      }
    }
    piVar4 = this->list;
    if (piVar4 != (int *)0x0) {
      while( true ) {
        lVar9 = (long)*piVar4;
        if (lVar9 == -1) break;
        this->list = piVar4 + 1;
        piVar4 = piVar4 + 1;
        if (plVar5[lVar9].validcount != iVar6) {
          plVar5 = plVar5 + lVar9;
LAB_004b7405:
          plVar5->validcount = iVar6;
          return plVar5;
        }
      }
    }
    iVar1 = this->curx;
    iVar2 = this->cury;
    iVar8 = iVar1 + 1;
    this->curx = iVar8;
    iVar6 = iVar2;
    if (this->maxx <= iVar1) {
      iVar8 = this->minx;
      this->curx = iVar8;
      iVar6 = iVar2 + 1;
      this->cury = iVar6;
      if (this->maxy <= iVar2) {
        return (line_t *)0x0;
      }
    }
    StartBlock(this,iVar8,iVar6);
  } while( true );
}

Assistant:

line_t *FBlockLinesIterator::Next()
{
	while (true)
	{
		while (polyLink != NULL)
		{
			if (polyLink->polyobj)
			{
				if (polyIndex == 0)
				{
					if (polyLink->polyobj->validcount == validcount)
					{
						polyLink = polyLink->next;
						continue;
					}
					polyLink->polyobj->validcount = validcount;
				}

				line_t *ld = polyLink->polyobj->Linedefs[polyIndex];

				if (++polyIndex >= (int)polyLink->polyobj->Linedefs.Size())
				{
					polyLink = polyLink->next;
					polyIndex = 0;
				}

				if (ld->validcount == validcount)
				{
					continue;
				}
				else
				{
					ld->validcount = validcount;
					return ld;
				}
			}
			else polyLink = polyLink->next;
		}

		if (list != NULL)
		{
			while (*list != -1)
			{
				line_t *ld = &lines[*list];

				list++;
				if (ld->validcount != validcount)
				{
					ld->validcount = validcount;
					return ld;
				}
			}
		}

		if (++curx > maxx)
		{
			curx = minx;
			if (++cury > maxy) return NULL;
		}
		StartBlock(curx, cury);
	}
}